

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite_tar.c
# Opt level: O2

void Help(void)

{
  puts(
      "============================================================\nUnQLite TAR                                                 \n                                         http://unqlite.org/\n============================================================\n"
      );
  puts("unqlite_tar db_name (-r|-w|-i) file1 [file2 ...]");
  puts("\t-w: Store one or more files in the database");
  puts("\t-r: Extract records from the database");
  puts("\t-i: Iterate over the stored files");
  exit(0);
}

Assistant:

static void Help(void)
{
	puts(zBanner);
	puts("unqlite_tar db_name (-r|-w|-i) file1 [file2 ...]");
	puts("\t-w: Store one or more files in the database");
	puts("\t-r: Extract records from the database");
	puts("\t-i: Iterate over the stored files");
	/* Exit immediately */
	exit(0);
}